

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIListBox::swapItems(CGUIListBox *this,u32 index1,u32 index2)

{
  pointer pLVar1;
  uint uVar2;
  ListItem dummmy;
  
  pLVar1 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (uint)(((long)(this->Items).m_data.
                        super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x48);
  if (index2 < uVar2 && index1 < uVar2) {
    ListItem::ListItem(&dummmy,pLVar1 + index1);
    pLVar1 = (this->Items).m_data.
             super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ListItem::operator=(pLVar1 + index1,pLVar1 + index2);
    ListItem::operator=((this->Items).m_data.
                        super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                        ._M_impl.super__Vector_impl_data._M_start + index2,&dummmy);
    ::std::__cxx11::wstring::_M_dispose();
  }
  return;
}

Assistant:

void CGUIListBox::swapItems(u32 index1, u32 index2)
{
	if (index1 >= Items.size() || index2 >= Items.size())
		return;

	ListItem dummmy = Items[index1];
	Items[index1] = Items[index2];
	Items[index2] = dummmy;
}